

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

vector<float,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pbrt::UniformGridMediumProvider::GetMaxDensityGrid
          (UniformGridMediumProvider *this,Allocator alloc,Point3i *res)

{
  reference pvVar1;
  int *in_RCX;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  Bounds3f bounds;
  int x;
  int y;
  int z;
  int offset;
  anon_class_8_1_8991fb9c getMaxDensity;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *maxGrid;
  Bounds3f *in_stack_00000260;
  anon_class_8_1_8991fb9c *in_stack_00000268;
  float in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  Float in_stack_ffffffffffffff44;
  Point3<float> *p2;
  Point3<float> *in_stack_ffffffffffffff68;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_ffffffffffffff70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  undefined8 local_3c;
  int local_34;
  Point3<float> local_30;
  undefined1 local_21;
  int *local_20;
  
  local_21 = 0;
  p2 = &local_30;
  local_20 = in_RCX;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<float> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (in_RDI,(polymorphic_allocator<float> *)p2);
  Point3<int>::Point3((Point3<int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      (int)in_stack_ffffffffffffff3c,(int)in_stack_ffffffffffffff38,0);
  local_20[2] = local_34;
  *(undefined8 *)local_20 = local_3c;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize
            (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
  local_5c = 0;
  for (local_60 = 0; local_60 < local_20[2]; local_60 = local_60 + 1) {
    for (local_64 = 0; local_64 < local_20[1]; local_64 = local_64 + 1) {
      for (local_68 = 0; local_68 < *local_20; local_68 = local_68 + 1) {
        Point3<float>::Point3
                  ((Point3<float> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,0.0);
        Point3<float>::Point3
                  ((Point3<float> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,0.0);
        Bounds3<float>::Bounds3
                  ((Bounds3<float> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,p2);
        in_stack_ffffffffffffff44 =
             GetMaxDensityGrid::anon_class_8_1_8991fb9c::operator()
                       (in_stack_00000268,in_stack_00000260);
        pvVar1 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           (in_RDI,(long)local_5c);
        *pvVar1 = in_stack_ffffffffffffff44;
        local_5c = local_5c + 1;
      }
    }
  }
  return in_RDI;
}

Assistant:

pstd::vector<Float> GetMaxDensityGrid(Allocator alloc, Point3i *res) const {
        pstd::vector<Float> maxGrid(alloc);
        // Set _gridResolution_ and allocate _maxGrid_
        *res = Point3i(4, 4, 4);
        maxGrid.resize(res->x * res->y * res->z);

        // Define _getMaxDensity_ lambda
        auto getMaxDensity = [&](const Bounds3f &bounds) -> Float {
            if (densityGrid)
                return densityGrid->MaximumValue(bounds);
            else {
                // Compute maximum density of RGB density over _bounds_
                int nx = rgbDensityGrid->xSize();
                int ny = rgbDensityGrid->ySize();
                int nz = rgbDensityGrid->zSize();
                Point3f ps[2] = {
                    Point3f(bounds.pMin.x * nx - .5f, bounds.pMin.y * ny - .5f,
                            bounds.pMin.z * nz - .5f),
                    Point3f(bounds.pMax.x * nx - .5f, bounds.pMax.y * ny - .5f,
                            bounds.pMax.z * nz - .5f)};
                Point3i pi[2] = {Max(Point3i(Floor(ps[0])), Point3i(0, 0, 0)),
                                 Min(Point3i(Floor(ps[1])) + Vector3i(1, 1, 1),
                                     Point3i(nx - 1, ny - 1, nz - 1))};

                std::vector<SampledWavelengths> lambdas;
                for (Float u : Stratified1D(16))
                    lambdas.push_back(SampledWavelengths::SampleXYZ(u));

                Float maxDensity = 0;
                for (int z = pi[0].z; z <= pi[1].z; ++z)
                    for (int y = pi[0].y; y <= pi[1].y; ++y)
                        for (int x = pi[0].x; x <= pi[1].x; ++x) {
                            RGB rgb = rgbDensityGrid->Lookup(Point3i(x, y, z));

                            Float maxComponent = std::max({rgb.r, rgb.g, rgb.b});
                            if (maxComponent == 0)
                                continue;

                            RGBSpectrum spec(*colorSpace, rgb);
                            for (const SampledWavelengths &lambda : lambdas) {
                                SampledSpectrum s = spec.Sample(lambda);
                                maxDensity = std::max(maxDensity, s.MaxComponentValue());
                            }
                        }

                return maxDensity * 1.025f;
            }
        };

        // Compute maximum density for each _maxGrid_ cell
        int offset = 0;
        for (int z = 0; z < res->z; ++z)
            for (int y = 0; y < res->y; ++y)
                for (int x = 0; x < res->x; ++x) {
                    Bounds3f bounds(
                        Point3f(Float(x) / res->x, Float(y) / res->y, Float(z) / res->z),
                        Point3f(Float(x + 1) / res->x, Float(y + 1) / res->y,
                                Float(z + 1) / res->z));
                    maxGrid[offset++] = getMaxDensity(bounds);
                }

        return maxGrid;
    }